

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

ssize_t __thiscall
sznet::net::TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  undefined8 uVar1;
  bool bVar2;
  ulong *in_RAX;
  ssize_t extraout_RAX;
  ulong *extraout_RAX_00;
  undefined4 in_register_00000034;
  long *plVar3;
  _Any_data local_a8;
  code *pcStack_98;
  code *pcStack_90;
  code *local_88;
  undefined8 local_80;
  ulong *local_78;
  undefined8 local_70;
  ulong local_68;
  undefined8 uStack_60;
  TcpConnection *local_58;
  ulong *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    bVar2 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar2) {
      sendInLoop(this,(void *)*plVar3,(long)(int)plVar3[1]);
      return extraout_RAX;
    }
    this_00 = this->m_loop;
    local_50 = (ulong *)&local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,*plVar3,(long)(int)plVar3[1] + *plVar3);
    uVar1 = local_48;
    local_88 = sendInLoop;
    local_80 = 0;
    if (local_50 == (ulong *)&local_40) {
      uStack_60 = uStack_38;
      local_78 = &local_68;
    }
    else {
      local_78 = local_50;
    }
    local_68 = CONCAT71(uStack_3f,local_40);
    local_70 = local_48;
    local_48 = 0;
    local_40 = 0;
    local_a8._M_unused._M_object = (void *)0x0;
    local_a8._8_8_ = 0;
    pcStack_98 = (code *)0x0;
    pcStack_90 = (code *)0x0;
    local_58 = this;
    local_50 = (ulong *)&local_40;
    local_a8._M_unused._M_object = operator_new(0x38);
    *(code **)local_a8._M_unused._0_8_ = sendInLoop;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
    *(code **)((long)local_a8._M_unused._0_8_ + 0x10) =
         (code *)((long)local_a8._M_unused._0_8_ + 0x20);
    if (local_78 == &local_68) {
      *(ulong *)((long)local_a8._M_unused._0_8_ + 0x20) = local_68;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x28) = uStack_60;
    }
    else {
      *(ulong **)((long)local_a8._M_unused._0_8_ + 0x10) = local_78;
      *(ulong *)((long)local_a8._M_unused._0_8_ + 0x20) = local_68;
    }
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = uVar1;
    local_70 = 0;
    local_68 = local_68 & 0xffffffffffffff00;
    *(TcpConnection **)((long)local_a8._M_unused._0_8_ + 0x30) = local_58;
    pcStack_90 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                 ::_M_invoke;
    pcStack_98 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                 ::_M_manager;
    local_78 = &local_68;
    EventLoop::runInLoop(this_00,(Functor *)&local_a8);
    if (pcStack_98 != (code *)0x0) {
      (*pcStack_98)(&local_a8,&local_a8,__destroy_functor);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    in_RAX = (ulong *)&local_40;
    if (local_50 != in_RAX) {
      operator_delete(local_50);
      in_RAX = extraout_RAX_00;
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void TcpConnection::send(const StringPiece& message)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(message);
		}
		else
		{
			void (TcpConnection::*fp)(const StringPiece& message) = &TcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, message.as_string()));
		}
	}
}